

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

VkResult __thiscall
Fossilize::VulkanDevice::create_sampler_with_ycbcr_remap
          (VulkanDevice *this,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  VkResult VVar1;
  VkBaseInStructure *mut_next;
  VkSamplerYcbcrConversionCreateInfo ycbcr;
  VkBaseInStructure *next;
  VkSamplerYcbcrConversion pVStack_30;
  VkResult vr;
  VkSamplerYcbcrConversion conv;
  VkSampler *sampler_local;
  VkSamplerCreateInfo *create_info_local;
  VulkanDevice *this_local;
  
  pVStack_30 = (VkSamplerYcbcrConversion)0x0;
  ycbcr._56_8_ = create_info->pNext;
  conv = (VkSamplerYcbcrConversion)sampler;
  sampler_local = (VkSampler *)create_info;
  create_info_local = (VkSamplerCreateInfo *)this;
  do {
    if (ycbcr._56_8_ == 0) {
      this_local._4_4_ =
           (*vkCreateSampler)(this->device,(VkSamplerCreateInfo *)sampler_local,
                              (VkAllocationCallbacks *)0x0,(VkSampler *)conv);
      if (this_local._4_4_ == VK_SUCCESS) {
        this_local._4_4_ = VK_SUCCESS;
      }
      return this_local._4_4_;
    }
    if (*(int *)ycbcr._56_8_ == 0x3b9d2b60) {
      memcpy(&mut_next,(void *)ycbcr._56_8_,0x40);
      ycbcr.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      ycbcr._4_4_ = 0;
      VVar1 = (*vkCreateSamplerYcbcrConversionKHR)
                        (this->device,(VkSamplerYcbcrConversionCreateInfo *)&mut_next,
                         (VkAllocationCallbacks *)0x0,&stack0xffffffffffffffd0);
      if (VVar1 != VK_SUCCESS) {
        return VVar1;
      }
      std::vector<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>::
      push_back(&this->ycbcr_conversions,&stack0xffffffffffffffd0);
      *(undefined4 *)ycbcr._56_8_ = 0x3b9d2b61;
      *(VkSamplerYcbcrConversion *)(ycbcr._56_8_ + 0x10) = pVStack_30;
    }
    ycbcr._56_8_ = *(undefined8 *)(ycbcr._56_8_ + 8);
  } while( true );
}

Assistant:

VkResult VulkanDevice::create_sampler_with_ycbcr_remap(const VkSamplerCreateInfo *create_info, VkSampler *sampler)
{
	VkSamplerYcbcrConversion conv = VK_NULL_HANDLE;
	VkResult vr;

	// Kinda hacky. Resolve Ycbcr sampler objects.
	// Replace the create info inline.
	const auto *next = static_cast<const VkBaseInStructure *>(create_info->pNext);
	while (next)
	{
		if (next->sType == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO)
		{
			auto ycbcr = *reinterpret_cast<const VkSamplerYcbcrConversionCreateInfo *>(next);
			ycbcr.pNext = nullptr;

			if ((vr = vkCreateSamplerYcbcrConversionKHR(device, &ycbcr, nullptr, &conv)) != VK_SUCCESS)
				return vr;

			ycbcr_conversions.push_back(conv);

			// Kinda icky, but we know the conversion info is smaller than the create info.
			// It's also safe to mutate the input structs we get from enqueue_create_sampler().
			auto *mut_next = const_cast<VkBaseInStructure *>(next);
			mut_next->sType = VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO;
			reinterpret_cast<VkSamplerYcbcrConversionInfo *>(mut_next)->conversion = conv;
		}

		next = static_cast<const VkBaseInStructure *>(next->pNext);
	}

	if ((vr = vkCreateSampler(device, create_info, nullptr, sampler)) != VK_SUCCESS)
		return vr;

	return VK_SUCCESS;
}